

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O2

wstring * __thiscall
mjs::number_to_radix_string_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,double x,int radix)

{
  undefined1 int_part;
  double x_00;
  double x_01;
  wstring local_38;
  
  if (((int)this == 10) || (0x22 < (int)this - 2U)) {
    __assert_fail("radix >= 2 && radix != 10 && radix <= 36",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                  ,0xf9,"std::wstring mjs::number_to_radix_string(double, int)");
  }
  int_part = false;
  if ((ulong)ABS(x) < 0x7ff0000000000000) {
    if ((x != 0.0) || (NAN(x))) {
      if (0.0 <= x) {
        x_00 = floor(x);
        x_01 = x - x_00;
        if ((x_00 != 0.0) || (NAN(x_00))) {
          (anonymous_namespace)::to_radix_string_inner_abi_cxx11_
                    (__return_storage_ptr__,(_anonymous_namespace_ *)((ulong)this & 0xffffffff),x_00
                     ,1,(bool)int_part);
        }
        else {
          std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                    ((wstring *)__return_storage_ptr__,L"0",(allocator<wchar_t> *)&local_38);
        }
        if ((x_01 == 0.0) && (!NAN(x_01))) {
          return __return_storage_ptr__;
        }
        std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
        (anonymous_namespace)::to_radix_string_inner_abi_cxx11_
                  (&local_38,(_anonymous_namespace_ *)((ulong)this & 0xffffffff),x_01,0,
                   (bool)int_part);
        std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
      }
      else {
        number_to_radix_string_abi_cxx11_(&local_38,(mjs *)((ulong)this & 0xffffffff),-x,radix);
        std::operator+(__return_storage_ptr__,L"-",&local_38);
      }
      std::__cxx11::wstring::~wstring((wstring *)&local_38);
    }
    else {
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                ((wstring *)__return_storage_ptr__,L"0",(allocator<wchar_t> *)&local_38);
    }
  }
  else {
    number_to_string_abi_cxx11_(__return_storage_ptr__,this,x);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring number_to_radix_string(double x, int radix) {
    assert(radix >= 2 && radix != 10 && radix <= 36);
    if (!std::isfinite(x)) {
        return number_to_string(x);
    } else if (x == 0.0) {
        return L"0";
    } else if (x < 0) {
        return L"-" + number_to_radix_string(-x, radix);
    }
    assert(std::isfinite(x) && x > 0);

    const double int_part  = std::floor(x);
    const double frac_part = x - int_part;

    auto res = int_part ? to_radix_string_inner(int_part, radix, true) : L"0";
    if (frac_part != 0.0) {
        res += '.';
        res += to_radix_string_inner(frac_part, radix, false);
    }

    return res;

}